

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O2

int thitu(int tlev,int dam,obj *obj,obj *ostack,monst *magr,char *name)

{
  bool bVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  int dam_local;
  int local_254;
  char *local_250;
  monst *local_248;
  obj *local_240;
  char knmbuf [256];
  char onmbuf [256];
  
  dam_local = dam;
  local_248 = magr;
  local_240 = ostack;
  if (name == (char *)0x0) {
    if (obj == (obj *)0x0) {
      panic("thitu: name & obj both null?");
    }
    if (obj->quan < 2) {
      pcVar5 = mshot_xname(obj);
    }
    else {
      pcVar5 = doname(obj);
    }
    name = onmbuf;
    strcpy(name,pcVar5);
    pcVar5 = killer_xname(obj);
    local_250 = knmbuf;
    strcpy(local_250,pcVar5);
    local_254 = 1;
LAB_001e7c54:
    bVar3 = obj_is_pname(obj);
    if (bVar3 == '\0') {
      if (obj->quan < 2) {
        bVar1 = false;
        goto LAB_001e7c76;
      }
    }
    else {
      name = the(name);
    }
LAB_001e7c8c:
    bVar6 = obj->otyp != 0x219;
    bVar2 = false;
  }
  else {
    iVar4 = strncasecmp(name,"the ",4);
    if ((iVar4 == 0) || (iVar4 = strncasecmp(name,"an ",3), iVar4 == 0)) {
LAB_001e7bd8:
      local_254 = 1;
    }
    else {
      iVar4 = strncasecmp(name,"a ",2);
      local_254 = 0;
      if (iVar4 == 0) goto LAB_001e7bd8;
    }
    local_250 = name;
    if (obj != (obj *)0x0) goto LAB_001e7c54;
    bVar1 = true;
LAB_001e7c76:
    name = an(name);
    bVar2 = true;
    bVar6 = true;
    if (!bVar1) goto LAB_001e7c8c;
  }
  iVar4 = rnd(0x14);
  if (iVar4 < u.uac + tlev) {
    if ((bVar2) ||
       (bVar3 = artifact_hit(local_248,&youmonst,obj,local_240,'\x01',&dam_local,iVar4),
       bVar3 == '\0')) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001e7d0b;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001e7d02;
LAB_001e7dba:
        if (flags.verbose == '\0') goto LAB_001e7de6;
        pcVar5 = exclam(dam_local);
        pline("You are hit by %s%s",name,pcVar5);
      }
      else {
LAB_001e7d02:
        if (ublindf != (obj *)0x0) {
LAB_001e7d0b:
          if (ublindf->oartifact == '\x1d') goto LAB_001e7dba;
        }
LAB_001e7de6:
        pline("You are hit!");
      }
      if (bVar2) goto LAB_001e7e54;
    }
    if (((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) == 0xe0) &&
       (bVar3 = hates_silver(youmonst.data), bVar3 != '\0')) {
      iVar4 = rnd(0x14);
      dam_local = dam_local + iVar4;
      pline("The silver sears your flesh!");
      exercise(4,'\0');
    }
LAB_001e7e54:
    if (!bVar6) {
      if ((u.uprops[7].extrinsic != 0) || (((byte)youmonst.mintrinsics & 0x40) != 0)) {
        pline("It doesn\'t seem to hurt you.");
        return 1;
      }
      pline("It burns!");
    }
    if (u.uprops[0x33].extrinsic != 0 || u.uprops[0x33].intrinsic != 0) {
      dam_local = (dam_local + 1) / 2;
    }
    losehp(dam_local,local_250,local_254);
    exercise(0,'\0');
    return 1;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001e7d34;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001e7d2f;
  }
  else {
LAB_001e7d2f:
    if (ublindf == (obj *)0x0) goto LAB_001e7d7f;
LAB_001e7d34:
    if (ublindf->oartifact != '\x1d') goto LAB_001e7d7f;
  }
  if (flags.verbose != '\0') {
    pline("You are almost hit by %s.",name);
    return 0;
  }
LAB_001e7d7f:
  pline("It misses.");
  return 0;
}

Assistant:

int thitu(int tlev, int dam,
	  struct obj *obj, struct obj *ostack, struct monst *magr,
	  const char *name)	/* if null, then format `obj' */
{
	const char *onm, *knm;
	boolean is_acid;
	int kprefix = KILLED_BY_AN;
	int dieroll;
	char onmbuf[BUFSZ], knmbuf[BUFSZ];

	if (!name) {
	    if (!obj) panic("thitu: name & obj both null?");
	    name = strcpy(onmbuf,
			 (obj->quan > 1L) ? doname(obj) : mshot_xname(obj));
	    knm = strcpy(knmbuf, killer_xname(obj));
	    kprefix = KILLED_BY;  /* killer_name supplies "an" if warranted */
	} else {
	    knm = name;
	    /* [perhaps ought to check for plural here to] */
	    if (!strncmpi(name, "the ", 4) ||
		    !strncmpi(name, "an ", 3) ||
		    !strncmpi(name, "a ", 2)) kprefix = KILLED_BY;
	}
	onm = (obj && obj_is_pname(obj)) ? the(name) :
			    (obj && obj->quan > 1L) ? name : an(name);
	is_acid = (obj && obj->otyp == ACID_VENOM);

	dieroll = rnd(20);
	if (u.uac + tlev <= dieroll) {
		if (Blind || !flags.verbose) pline("It misses.");
		else pline("You are almost hit by %s.", onm);
		return 0;
	} else {
		if (!obj || !artifact_hit(magr, &youmonst, obj, ostack, TRUE,
					  &dam, dieroll)) {
			if (Blind || !flags.verbose) pline("You are hit!");
			else pline("You are hit by %s%s", onm, exclam(dam));
		}

		if (obj && objects[obj->otyp].oc_material == SILVER
				&& hates_silver(youmonst.data)) {
			dam += rnd(20);
			pline("The silver sears your flesh!");
			exercise(A_CON, FALSE);
		}
		if (is_acid && Acid_resistance)
			pline("It doesn't seem to hurt you.");
		else {
			if (is_acid) pline("It burns!");
			if (Half_physical_damage) dam = (dam+1) / 2;
			losehp(dam, knm, kprefix);
			exercise(A_STR, FALSE);
		}
		return 1;
	}
}